

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_mm_comp_cdata(jit_State *J,RecordIndex *ix,int op,MMS mm)

{
  MMS mm_local;
  int op_local;
  RecordIndex *ix_local;
  jit_State *J_local;
  
  lj_snap_add(J);
  if ((ix->val & 0x1f000000) == 0xa000000) {
    ix->tab = ix->val;
    ix->tabv = ix->valv;
  }
  else {
    ix->tab = ix->key;
    ix->tabv = ix->keyv;
  }
  lj_record_mm_lookup(J,ix,mm);
  rec_mm_callcomp(J,ix,op);
  return;
}

Assistant:

static void rec_mm_comp_cdata(jit_State *J, RecordIndex *ix, int op, MMS mm)
{
  lj_snap_add(J);
  if (tref_iscdata(ix->val)) {
    ix->tab = ix->val;
    copyTV(J->L, &ix->tabv, &ix->valv);
  } else {
    lj_assertJ(tref_iscdata(ix->key), "cdata expected");
    ix->tab = ix->key;
    copyTV(J->L, &ix->tabv, &ix->keyv);
  }
  lj_record_mm_lookup(J, ix, mm);
  rec_mm_callcomp(J, ix, op);
}